

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_decimal.cpp
# Opt level: O3

bool __thiscall
icu_63::numparse::impl::DecimalMatcher::match
          (DecimalMatcher *this,StringSegment *segment,ParsedNumber *result,int8_t exponentSign,
          UErrorCode *param_4)

{
  short sVar1;
  UnicodeString *pUVar2;
  bool bVar3;
  UBool UVar4;
  int32_t iVar5;
  int32_t iVar6;
  uint c;
  uint uVar7;
  int32_t iVar8;
  int iVar9;
  int64_t iVar10;
  bool bVar11;
  int iVar12;
  undefined7 in_register_00000009;
  __off_t __length;
  long lVar13;
  undefined4 uVar14;
  char *__file;
  int32_t i;
  ulong uVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  UnicodeString actualDecimalString;
  DecimalQuantity digitsConsumed;
  UnicodeString actualGroupingString;
  uint local_18c;
  int local_188;
  uint local_184;
  int32_t local_180;
  int local_17c;
  int32_t local_174;
  int local_15c;
  UnicodeString local_140;
  DecimalQuantity local_100;
  UnicodeString local_b0;
  UnicodeString local_70;
  
  bVar3 = ParsedNumber::seenNumber(result);
  if (exponentSign == '\0' && bVar3) {
    return false;
  }
  iVar5 = StringSegment::getOffset(segment);
  icu_63::number::impl::DecimalQuantity::DecimalQuantity(&local_100);
  local_100.bogus = true;
  local_b0.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003e5ab8;
  local_b0.fUnion.fStackFields.fLengthAndFlags = 2;
  local_140.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003e5ab8;
  local_140.fUnion.fStackFields.fLengthAndFlags = 2;
  UnicodeString::setToBogus(&local_b0);
  UnicodeString::setToBogus(&local_140);
  local_17c = 0;
  local_184 = 0xffffffff;
  local_188 = -1;
  local_174 = -1;
  local_180 = 0;
  local_15c = 0;
  bVar3 = false;
  do {
    iVar12 = local_188;
    local_18c = 0;
LAB_002836db:
    iVar6 = StringSegment::length(segment);
    if (iVar6 < 1) goto LAB_00283bc7;
    c = StringSegment::getCodePoint(segment);
    UVar4 = u_isdigit_63(c);
    if (UVar4 == '\0') {
LAB_00283740:
      if ((this->fLocalDigitStrings).super_LocalPointerBase<const_icu_63::UnicodeString>.ptr !=
          (UnicodeString *)0x0) {
        lVar13 = 0;
        uVar15 = 0;
        bVar3 = false;
        do {
          pUVar2 = (this->fLocalDigitStrings).super_LocalPointerBase<const_icu_63::UnicodeString>.
                   ptr;
          if (0x1f < *(ushort *)((long)&pUVar2->fUnion + lVar13)) {
            iVar6 = StringSegment::getCommonPrefixLength
                              (segment,(UnicodeString *)
                                       ((long)&(pUVar2->super_Replaceable).super_UObject.
                                               _vptr_UObject + lVar13));
            sVar1 = *(short *)((long)&pUVar2->fUnion + lVar13);
            if (sVar1 < 0) {
              iVar9 = *(int *)((long)&pUVar2->fUnion + lVar13 + 4);
            }
            else {
              iVar9 = (int)sVar1 >> 5;
            }
            if (iVar6 == iVar9) goto LAB_002837b7;
            bVar16 = !bVar3;
            bVar3 = true;
            if (bVar16) {
              iVar8 = StringSegment::length(segment);
              bVar3 = iVar6 == iVar8;
            }
          }
          uVar15 = uVar15 + 1;
          lVar13 = lVar13 + 0x40;
          if (uVar15 == 10) goto LAB_00283818;
        } while( true );
      }
      bVar3 = false;
    }
    else {
      StringSegment::adjustOffset(segment,2 - (uint)(c < 0x10000));
      uVar7 = u_digit_63(c,'\n');
      uVar15 = (ulong)uVar7;
      if ((char)uVar7 == -1) goto LAB_00283740;
      bVar3 = false;
      if (-1 < (char)uVar7) goto LAB_002837c3;
    }
LAB_00283818:
    bVar16 = false;
    if (((local_140.fUnion._0_4_ & 1) != 0) &&
       (0x1f < (ushort)(this->decimalSeparator).fUnion.fStackFields.fLengthAndFlags)) {
      iVar6 = StringSegment::getCommonPrefixLength(segment,&this->decimalSeparator);
      bVar16 = bVar3 == false;
      bVar3 = true;
      if (bVar16) {
        iVar8 = StringSegment::length(segment);
        bVar3 = iVar6 == iVar8;
      }
      sVar1 = (this->decimalSeparator).fUnion.fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        iVar9 = (this->decimalSeparator).fUnion.fFields.fLength;
      }
      else {
        iVar9 = (int)sVar1 >> 5;
      }
      if (iVar6 == iVar9) {
        bVar16 = true;
        UnicodeString::operator=(&local_140,&this->decimalSeparator);
      }
      else {
        bVar16 = false;
      }
    }
    uVar7 = (uint)(ushort)local_b0.fUnion.fStackFields.fLengthAndFlags;
    if ((local_b0.fUnion.fStackFields.fLengthAndFlags & 1U) == 0) {
      iVar6 = StringSegment::getCommonPrefixLength(segment,&local_b0);
      bVar17 = bVar3 == false;
      bVar3 = true;
      if (bVar17) {
        iVar8 = StringSegment::length(segment);
        bVar3 = iVar6 == iVar8;
      }
      uVar7 = (uint)local_b0.fUnion.fStackFields.fLengthAndFlags;
      uVar14 = local_b0.fUnion.fFields.fLength;
      if (-1 < local_b0.fUnion.fStackFields.fLengthAndFlags) {
        uVar14 = (int)uVar7 >> 5;
      }
      bVar17 = iVar6 == uVar14;
    }
    else {
      bVar17 = false;
    }
    if ((((this->groupingDisabled == false) && ((uVar7 & 1) != 0)) &&
        ((local_140.fUnion._0_4_ & 1) != 0)) &&
       (0x1f < (ushort)(this->groupingSeparator).fUnion.fStackFields.fLengthAndFlags)) {
      iVar6 = StringSegment::getCommonPrefixLength(segment,&this->groupingSeparator);
      bVar18 = bVar3 == false;
      bVar3 = true;
      if (bVar18) {
        iVar8 = StringSegment::length(segment);
        bVar3 = iVar6 == iVar8;
      }
      sVar1 = (this->groupingSeparator).fUnion.fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        iVar9 = (this->groupingSeparator).fUnion.fFields.fLength;
      }
      else {
        iVar9 = (int)sVar1 >> 5;
      }
      if (iVar6 != iVar9) goto LAB_00283961;
      bVar17 = true;
      UnicodeString::operator=(&local_b0,&this->groupingSeparator);
    }
    else {
LAB_00283961:
      if (((!bVar17) && ((local_140.fUnion._0_4_ & 1) != 0)) &&
         (UVar4 = UnicodeSet::contains(this->decimalUniSet,c), UVar4 != '\0')) {
        UnicodeString::UnicodeString(&local_70,c);
        UnicodeString::moveFrom(&local_140,&local_70);
        UnicodeString::~UnicodeString(&local_70);
        bVar16 = true;
      }
    }
    if (((this->groupingDisabled == false) &&
        ((local_b0.fUnion.fStackFields.fLengthAndFlags & 1U) != 0)) &&
       (((local_140.fUnion._0_4_ & 1) != 0 &&
        (UVar4 = UnicodeSet::contains(this->groupingUniSet,c), UVar4 != '\0')))) {
      UnicodeString::UnicodeString(&local_70,c);
      UnicodeString::moveFrom(&local_b0,&local_70);
      UnicodeString::~UnicodeString(&local_70);
      bVar17 = true;
    }
    if (bVar16) {
      if (this->integerOnly != false) goto LAB_00283bc7;
    }
    else if (!bVar17) goto LAB_00283bc7;
    if ((local_17c == 2) && (bVar17)) {
      local_188 = 2;
      goto LAB_00283c1d;
    }
    bVar18 = this->requireGroupingMatch;
    if (bVar18 == true) {
      if (local_188 == 1) {
        bVar11 = local_184 == (int)this->grouping2;
      }
      else {
        bVar11 = true;
        if (local_188 == 0) {
          bVar11 = (int)local_184 <= (int)this->grouping2 && local_184 != 0;
        }
      }
      bVar19 = true;
      if (local_17c == 1) {
        bVar19 = local_18c == (int)this->grouping1;
      }
    }
    else {
      bVar11 = local_184 != 1 || local_188 != 1;
      bVar19 = local_18c != 1 || local_17c != 1;
    }
    if ((!bVar11) || (!bVar19 && bVar16)) {
      if (bVar18 == true && !(bool)(bVar17 & local_18c == 0)) {
        icu_63::number::impl::DecimalQuantity::clear(&local_100);
        local_100.bogus = true;
      }
      goto LAB_00283bc7;
    }
    if ((bVar18 & local_18c == 0 & local_17c == 1) != 0) goto LAB_00283bb7;
    local_188 = local_17c;
    if (bVar16) {
      local_188 = -1;
    }
    iVar6 = local_180;
    if (local_18c != 0) {
      iVar6 = StringSegment::getOffset(segment);
    }
    if (bVar17) {
      uVar14 = local_b0.fUnion.fFields.fLength;
      if (-1 < local_b0.fUnion.fStackFields.fLengthAndFlags) {
        uVar14 = (int)local_b0.fUnion.fStackFields.fLengthAndFlags >> 5;
      }
      local_17c = 1;
      StringSegment::adjustOffset(segment,uVar14);
      local_184 = local_18c;
      local_174 = local_180;
      local_180 = iVar6;
    }
    else {
      uVar14 = local_140.fUnion.fFields.fLength;
      if (-1 < local_140.fUnion.fStackFields.fLengthAndFlags) {
        uVar14 = (int)local_140.fUnion.fStackFields.fLengthAndFlags >> 5;
      }
      local_17c = 2;
      StringSegment::adjustOffset(segment,uVar14);
      local_184 = local_18c;
      local_174 = local_180;
      local_180 = iVar6;
    }
  } while( true );
LAB_002837b7:
  StringSegment::adjustOffset(segment,iVar6);
LAB_002837c3:
  if (local_100.bogus == true) {
    local_100.bogus = false;
    icu_63::number::impl::DecimalQuantity::clear(&local_100);
  }
  icu_63::number::impl::DecimalQuantity::appendDigit(&local_100,(int8_t)uVar15,0,true);
  local_18c = local_18c + 1;
  local_15c = local_15c + (~local_140.fUnion._0_4_ & 1);
  goto LAB_002836db;
LAB_00283bb7:
  local_17c = 1;
  local_18c = 0;
LAB_00283bc7:
  if (local_18c == 0 && local_17c != 2) {
    StringSegment::setOffset(segment,local_180);
    bVar3 = true;
    iVar12 = 0;
    local_18c = local_184;
    local_180 = local_174;
    local_174 = -1;
    local_184 = 1;
  }
  else {
    local_188 = local_17c;
  }
LAB_00283c1d:
  if (this->requireGroupingMatch == true) {
    if (iVar12 == 1) {
      bVar16 = local_184 == (int)this->grouping2;
    }
    else {
      bVar16 = true;
      if (iVar12 == 0) {
        bVar16 = (int)local_184 <= (int)this->grouping2 && local_184 != 0;
      }
    }
    if (local_188 != 1) goto LAB_00283d04;
    bVar17 = local_18c != (int)this->grouping1;
  }
  else {
    if ((local_184 == 1) && (iVar12 == 1)) {
      StringSegment::setOffset(segment,local_174);
      if (local_18c == 0xffffffff) {
        bVar16 = true;
      }
      else {
        __file = (char *)(ulong)~local_18c;
LAB_00283cb1:
        icu_63::number::impl::DecimalQuantity::adjustMagnitude(&local_100,(int32_t)__file);
        bVar16 = true;
        icu_63::number::impl::DecimalQuantity::truncate(&local_100,__file,__length);
      }
    }
    else {
      bVar16 = true;
      if ((iVar12 != 0 || local_184 != 0) && ((local_18c == 1 && (local_188 == 1)))) {
        StringSegment::setOffset(segment,local_180);
        __file = (char *)0xffffffff;
        bVar3 = true;
        goto LAB_00283cb1;
      }
    }
LAB_00283d04:
    if (local_188 == 2) goto LAB_00283d1d;
    bVar17 = false;
  }
  if ((bVar17) || (!bVar16)) {
    local_100.bogus = true;
  }
LAB_00283d1d:
  if (local_100.bogus == true) {
    bVar16 = true;
    if (bVar3 == false) {
      iVar6 = StringSegment::length(segment);
      bVar16 = iVar6 == 0;
    }
    StringSegment::setOffset(segment,iVar5);
  }
  else {
    icu_63::number::impl::DecimalQuantity::adjustMagnitude(&local_100,-local_15c);
    if ((exponentSign == '\0') || (iVar6 = StringSegment::getOffset(segment), iVar6 == iVar5)) {
      icu_63::number::impl::DecimalQuantity::operator=(&result->quantity,&local_100);
    }
    else {
      bVar16 = icu_63::number::impl::DecimalQuantity::fitsInLong(&local_100,false);
      if (((!bVar16) ||
          (iVar10 = icu_63::number::impl::DecimalQuantity::toLong(&local_100,false),
          0x7fffffff < iVar10)) ||
         (bVar16 = icu_63::number::impl::DecimalQuantity::adjustMagnitude
                             (&result->quantity,
                              (int)iVar10 * (int)CONCAT71(in_register_00000009,exponentSign)),
         bVar16)) {
        if (exponentSign == -1) {
          icu_63::number::impl::DecimalQuantity::clear(&result->quantity);
        }
        else {
          (result->quantity).bogus = true;
          *(byte *)&result->flags = (byte)result->flags | 0x80;
        }
      }
    }
    if ((local_140.fUnion._0_4_ & 1) == 0) {
      *(byte *)&result->flags = (byte)result->flags | 0x20;
    }
    ParsedNumber::setCharsConsumed(result,segment);
    iVar5 = StringSegment::length(segment);
    bVar16 = (bool)(iVar5 == 0 | bVar3);
  }
  UnicodeString::~UnicodeString(&local_140);
  UnicodeString::~UnicodeString(&local_b0);
  icu_63::number::impl::DecimalQuantity::~DecimalQuantity(&local_100);
  return bVar16;
}

Assistant:

bool DecimalMatcher::match(StringSegment& segment, ParsedNumber& result, int8_t exponentSign,
                           UErrorCode&) const {
    if (result.seenNumber() && exponentSign == 0) {
        // A number has already been consumed.
        return false;
    } else if (exponentSign != 0) {
        // scientific notation always comes after the number
        U_ASSERT(!result.quantity.bogus);
    }

    // Initial offset before any character consumption.
    int32_t initialOffset = segment.getOffset();

    // Return value: whether to ask for more characters.
    bool maybeMore = false;

    // All digits consumed so far.
    number::impl::DecimalQuantity digitsConsumed;
    digitsConsumed.bogus = true;

    // The total number of digits after the decimal place, used for scaling the result.
    int32_t digitsAfterDecimalPlace = 0;

    // The actual grouping and decimal separators used in the string.
    // If non-null, we have seen that token.
    UnicodeString actualGroupingString;
    UnicodeString actualDecimalString;
    actualGroupingString.setToBogus();
    actualDecimalString.setToBogus();

    // Information for two groups: the previous group and the current group.
    //
    // Each group has three pieces of information:
    //
    // Offset: the string position of the beginning of the group, including a leading separator
    // if there was a leading separator. This is needed in case we need to rewind the parse to
    // that position.
    //
    // Separator type:
    // 0 => beginning of string
    // 1 => lead separator is a grouping separator
    // 2 => lead separator is a decimal separator
    //
    // Count: the number of digits in the group. If -1, the group has been validated.
    int32_t currGroupOffset = 0;
    int32_t currGroupSepType = 0;
    int32_t currGroupCount = 0;
    int32_t prevGroupOffset = -1;
    int32_t prevGroupSepType = -1;
    int32_t prevGroupCount = -1;

    while (segment.length() > 0) {
        maybeMore = false;

        // Attempt to match a digit.
        int8_t digit = -1;

        // Try by code point digit value.
        UChar32 cp = segment.getCodePoint();
        if (u_isdigit(cp)) {
            segment.adjustOffset(U16_LENGTH(cp));
            digit = static_cast<int8_t>(u_digit(cp, 10));
        }

        // Try by digit string.
        if (digit == -1 && !fLocalDigitStrings.isNull()) {
            for (int32_t i = 0; i < 10; i++) {
                const UnicodeString& str = fLocalDigitStrings[i];
                if (str.isEmpty()) {
                    continue;
                }
                int32_t overlap = segment.getCommonPrefixLength(str);
                if (overlap == str.length()) {
                    segment.adjustOffset(overlap);
                    digit = static_cast<int8_t>(i);
                    break;
                }
                maybeMore = maybeMore || (overlap == segment.length());
            }
        }

        if (digit >= 0) {
            // Digit was found.
            if (digitsConsumed.bogus) {
                digitsConsumed.bogus = false;
                digitsConsumed.clear();
            }
            digitsConsumed.appendDigit(digit, 0, true);
            currGroupCount++;
            if (!actualDecimalString.isBogus()) {
                digitsAfterDecimalPlace++;
            }
            continue;
        }

        // Attempt to match a literal grouping or decimal separator.
        bool isDecimal = false;
        bool isGrouping = false;

        // 1) Attempt the decimal separator string literal.
        // if (we have not seen a decimal separator yet) { ... }
        if (actualDecimalString.isBogus() && !decimalSeparator.isEmpty()) {
            int32_t overlap = segment.getCommonPrefixLength(decimalSeparator);
            maybeMore = maybeMore || (overlap == segment.length());
            if (overlap == decimalSeparator.length()) {
                isDecimal = true;
                actualDecimalString = decimalSeparator;
            }
        }

        // 2) Attempt to match the actual grouping string literal.
        if (!actualGroupingString.isBogus()) {
            int32_t overlap = segment.getCommonPrefixLength(actualGroupingString);
            maybeMore = maybeMore || (overlap == segment.length());
            if (overlap == actualGroupingString.length()) {
                isGrouping = true;
            }
        }

        // 2.5) Attempt to match a new the grouping separator string literal.
        // if (we have not seen a grouping or decimal separator yet) { ... }
        if (!groupingDisabled && actualGroupingString.isBogus() && actualDecimalString.isBogus() &&
            !groupingSeparator.isEmpty()) {
            int32_t overlap = segment.getCommonPrefixLength(groupingSeparator);
            maybeMore = maybeMore || (overlap == segment.length());
            if (overlap == groupingSeparator.length()) {
                isGrouping = true;
                actualGroupingString = groupingSeparator;
            }
        }

        // 3) Attempt to match a decimal separator from the equivalence set.
        // if (we have not seen a decimal separator yet) { ... }
        // The !isGrouping is to confirm that we haven't yet matched the current character.
        if (!isGrouping && actualDecimalString.isBogus()) {
            if (decimalUniSet->contains(cp)) {
                isDecimal = true;
                actualDecimalString = UnicodeString(cp);
            }
        }

        // 4) Attempt to match a grouping separator from the equivalence set.
        // if (we have not seen a grouping or decimal separator yet) { ... }
        if (!groupingDisabled && actualGroupingString.isBogus() && actualDecimalString.isBogus()) {
            if (groupingUniSet->contains(cp)) {
                isGrouping = true;
                actualGroupingString = UnicodeString(cp);
            }
        }

        // Leave if we failed to match this as a separator.
        if (!isDecimal && !isGrouping) {
            break;
        }

        // Check for conditions when we don't want to accept the separator.
        if (isDecimal && integerOnly) {
            break;
        } else if (currGroupSepType == 2 && isGrouping) {
            // Fraction grouping
            break;
        }

        // Validate intermediate grouping sizes.
        bool prevValidSecondary = validateGroup(prevGroupSepType, prevGroupCount, false);
        bool currValidPrimary = validateGroup(currGroupSepType, currGroupCount, true);
        if (!prevValidSecondary || (isDecimal && !currValidPrimary)) {
            // Invalid grouping sizes.
            if (isGrouping && currGroupCount == 0) {
                // Trailing grouping separators: these are taken care of below
                U_ASSERT(currGroupSepType == 1);
            } else if (requireGroupingMatch) {
                // Strict mode: reject the parse
                digitsConsumed.clear();
                digitsConsumed.bogus = true;
            }
            break;
        } else if (requireGroupingMatch && currGroupCount == 0 && currGroupSepType == 1) {
            break;
        } else {
            // Grouping sizes OK so far.
            prevGroupOffset = currGroupOffset;
            prevGroupCount = currGroupCount;
            if (isDecimal) {
                // Do not validate this group any more.
                prevGroupSepType = -1;
            } else {
                prevGroupSepType = currGroupSepType;
            }
        }

        // OK to accept the separator.
        // Special case: don't update currGroup if it is empty; this allows two grouping
        // separators in a row in lenient mode.
        if (currGroupCount != 0) {
            currGroupOffset = segment.getOffset();
        }
        currGroupSepType = isGrouping ? 1 : 2;
        currGroupCount = 0;
        if (isGrouping) {
            segment.adjustOffset(actualGroupingString.length());
        } else {
            segment.adjustOffset(actualDecimalString.length());
        }
    }

    // End of main loop.
    // Back up if there was a trailing grouping separator.
    // Shift prev -> curr so we can check it as a final group.
    if (currGroupSepType != 2 && currGroupCount == 0) {
        maybeMore = true;
        segment.setOffset(currGroupOffset);
        currGroupOffset = prevGroupOffset;
        currGroupSepType = prevGroupSepType;
        currGroupCount = prevGroupCount;
        prevGroupOffset = -1;
        prevGroupSepType = 0;
        prevGroupCount = 1;
    }

    // Validate final grouping sizes.
    bool prevValidSecondary = validateGroup(prevGroupSepType, prevGroupCount, false);
    bool currValidPrimary = validateGroup(currGroupSepType, currGroupCount, true);
    if (!requireGroupingMatch) {
        // The cases we need to handle here are lone digits.
        // Examples: "1,1"  "1,1,"  "1,1,1"  "1,1,1,"  ",1" (all parse as 1)
        // See more examples in numberformattestspecification.txt
        int32_t digitsToRemove = 0;
        if (!prevValidSecondary) {
            segment.setOffset(prevGroupOffset);
            digitsToRemove += prevGroupCount;
            digitsToRemove += currGroupCount;
        } else if (!currValidPrimary && (prevGroupSepType != 0 || prevGroupCount != 0)) {
            maybeMore = true;
            segment.setOffset(currGroupOffset);
            digitsToRemove += currGroupCount;
        }
        if (digitsToRemove != 0) {
            digitsConsumed.adjustMagnitude(-digitsToRemove);
            digitsConsumed.truncate();
        }
        prevValidSecondary = true;
        currValidPrimary = true;
    }
    if (currGroupSepType != 2 && (!prevValidSecondary || !currValidPrimary)) {
        // Grouping failure.
        digitsConsumed.bogus = true;
    }

    // Strings that start with a separator but have no digits,
    // or strings that failed a grouping size check.
    if (digitsConsumed.bogus) {
        maybeMore = maybeMore || (segment.length() == 0);
        segment.setOffset(initialOffset);
        return maybeMore;
    }

    // We passed all inspections. Start post-processing.

    // Adjust for fraction part.
    digitsConsumed.adjustMagnitude(-digitsAfterDecimalPlace);

    // Set the digits, either normal or exponent.
    if (exponentSign != 0 && segment.getOffset() != initialOffset) {
        bool overflow = false;
        if (digitsConsumed.fitsInLong()) {
            int64_t exponentLong = digitsConsumed.toLong(false);
            U_ASSERT(exponentLong >= 0);
            if (exponentLong <= INT32_MAX) {
                auto exponentInt = static_cast<int32_t>(exponentLong);
                if (result.quantity.adjustMagnitude(exponentSign * exponentInt)) {
                    overflow = true;
                }
            } else {
                overflow = true;
            }
        } else {
            overflow = true;
        }
        if (overflow) {
            if (exponentSign == -1) {
                // Set to zero
                result.quantity.clear();
            } else {
                // Set to infinity
                result.quantity.bogus = true;
                result.flags |= FLAG_INFINITY;
            }
        }
    } else {
        result.quantity = digitsConsumed;
    }

    // Set other information into the result and return.
    if (!actualDecimalString.isBogus()) {
        result.flags |= FLAG_HAS_DECIMAL_SEPARATOR;
    }
    result.setCharsConsumed(segment);
    return segment.length() == 0 || maybeMore;
}